

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O2

bool __thiscall Directory::create(Directory *this,int mode)

{
  bool bVar1;
  int iVar2;
  Directory parent_dir;
  string local_90;
  File local_70;
  
  Path::parent_abi_cxx11_(&local_90,&(this->super_File).super_Path);
  Directory((Directory *)&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = Path::exists(&local_70.super_Path);
  if (!bVar1) {
    bVar1 = create((Directory *)&local_70,mode);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_001518a9;
    }
  }
  iVar2 = mkdir((this->super_File).super_Path._data._M_dataplus._M_p,mode);
  bVar1 = iVar2 == 0;
LAB_001518a9:
  File::~File(&local_70);
  return bVar1;
}

Assistant:

bool Directory::create (int mode /* = 0755 */)
{
  // No error handling because we want failure to be silent, somewhat emulating
  // "mkdir -p".
  Directory parent_dir = parent ();
  if (! parent_dir.exists ())
  {
      if (! parent_dir.create (mode))
      {
          return false;
      }
  }
  return mkdir (_data.c_str (), mode) == 0;
}